

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_function.c
# Opt level: O1

value function_metadata(function_conflict func)

{
  char *__s;
  value pvVar1;
  value *ppvVar2;
  value pvVar3;
  size_t length;
  value pvVar4;
  value pvVar5;
  value pvVar6;
  
  pvVar1 = value_create_array((value *)0x0,2);
  pvVar3 = (value)0x0;
  if (pvVar1 != (value)0x0) {
    ppvVar2 = value_to_array(pvVar1);
    pvVar3 = value_create_string("name",4);
    *ppvVar2 = pvVar3;
    if (pvVar3 != (value)0x0) {
      __s = func->name;
      length = strlen(__s);
      pvVar4 = value_create_string(__s,length);
      ppvVar2[1] = pvVar4;
      pvVar3 = pvVar1;
      if (pvVar4 != (value)0x0) goto LAB_001065d3;
    }
    value_type_destroy(pvVar1);
    pvVar3 = (value)0x0;
  }
LAB_001065d3:
  if (pvVar3 == (value)0x0) {
    return (value)0x0;
  }
  pvVar4 = value_create_array((value *)0x0,2);
  pvVar1 = (value)0x0;
  if (pvVar4 != (value)0x0) {
    ppvVar2 = value_to_array(pvVar4);
    pvVar1 = value_create_string("signature",9);
    *ppvVar2 = pvVar1;
    if (pvVar1 != (value)0x0) {
      pvVar5 = signature_metadata(func->s);
      ppvVar2[1] = pvVar5;
      pvVar1 = pvVar4;
      if (pvVar5 != (value)0x0) goto LAB_00106639;
    }
    value_type_destroy(pvVar4);
    pvVar1 = (value)0x0;
  }
LAB_00106639:
  if (pvVar1 == (value)0x0) goto LAB_001066e6;
  pvVar5 = value_create_array((value *)0x0,2);
  pvVar4 = (value)0x0;
  if (pvVar5 != (value)0x0) {
    ppvVar2 = value_to_array(pvVar5);
    pvVar4 = value_create_string("async",5);
    *ppvVar2 = pvVar4;
    if (pvVar4 != (value)0x0) {
      pvVar6 = value_create_bool('\0');
      ppvVar2[1] = pvVar6;
      pvVar4 = pvVar5;
      if (pvVar6 != (value)0x0) goto LAB_001066a8;
    }
    value_type_destroy(pvVar5);
    pvVar4 = (value)0x0;
  }
LAB_001066a8:
  if (pvVar4 != (value)0x0) {
    pvVar5 = value_create_map((value *)0x0,3);
    if (pvVar5 != (value)0x0) {
      ppvVar2 = value_to_map(pvVar5);
      *ppvVar2 = pvVar3;
      ppvVar2[1] = pvVar1;
      ppvVar2[2] = pvVar4;
      return pvVar5;
    }
    value_type_destroy(pvVar4);
  }
  value_type_destroy(pvVar1);
LAB_001066e6:
  value_type_destroy(pvVar3);
  return (value)0x0;
}

Assistant:

value function_metadata(function func)
{
	value name, sig, async, f;
	value *f_map;

	/* Create function name array */
	name = function_metadata_name(func);

	if (name == NULL)
	{
		goto error_name;
	}

	/* Create signature array */
	sig = function_metadata_signature(func);

	if (sig == NULL)
	{
		goto error_signature;
	}

	/* Create function async array */
	async = function_metadata_async(func);

	if (async == NULL)
	{
		goto error_async;
	}

	/* Create function map (name + signature + async) */
	f = value_create_map(NULL, 3);

	if (f == NULL)
	{
		goto error_function;
	}

	f_map = value_to_map(f);

	f_map[0] = name;
	f_map[1] = sig;
	f_map[2] = async;

	return f;

error_function:
	value_type_destroy(async);
error_async:
	value_type_destroy(sig);
error_signature:
	value_type_destroy(name);
error_name:
	return NULL;
}